

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void icu_63::parseRRULE(UnicodeString *rrule,int32_t *month,int32_t *dow,int32_t *wim,int32_t *dom,
                       int32_t *domCount,UDate *until,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  int8_t iVar5;
  char16_t cVar6;
  int32_t iVar7;
  undefined4 uVar8;
  UErrorCode UVar9;
  int start;
  int iVar10;
  long lVar11;
  undefined1 *puVar12;
  UDate UVar13;
  long local_1d0;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  ConstChar16Ptr local_1a0;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  int *local_188;
  UnicodeString value;
  UnicodeString attr;
  UnicodeString prop;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *month = -1;
    *dow = 0;
    *wim = 0;
    *until = -1.84303902528e+17;
    prop.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
    prop.fUnion.fStackFields.fLengthAndFlags = 2;
    attr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
    attr.fUnion.fStackFields.fLengthAndFlags = 2;
    value.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
    value.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar1 = true;
    start = 0;
    bVar3 = true;
    local_1d0 = 0;
    local_188 = domCount;
    do {
      while( true ) {
        if (!bVar1) {
          if (!bVar3) {
            *local_188 = (int)local_1d0;
            goto LAB_0021491d;
          }
          goto LAB_002148f3;
        }
        iVar7 = UnicodeString::indexOf(rrule,L';',start);
        if (iVar7 == -1) {
          UnicodeString::setTo(&prop,rrule,start);
        }
        else {
          UnicodeString::setTo(&prop,rrule,start,iVar7 - start);
          start = iVar7 + 1;
        }
        bVar1 = iVar7 != -1;
        iVar7 = UnicodeString::indexOf(&prop,L'=');
        if (iVar7 == -1) goto LAB_002148f3;
        UnicodeString::setTo(&attr,&prop,0,iVar7);
        UnicodeString::setTo(&value,&prop,iVar7 + 1);
        local_190.p_ = (char16_t *)ICAL_FREQ;
        iVar5 = UnicodeString::compare(&attr,&local_190,-1);
        if (iVar5 == '\0') break;
        local_1a0.p_ = (char16_t *)ICAL_UNTIL;
        iVar5 = UnicodeString::compare(&attr,&local_1a0,-1);
        if (iVar5 == '\0') {
          UVar13 = parseDateTimeString(&value,0,status);
          *until = UVar13;
          if (U_ZERO_ERROR < *status) goto LAB_0021491d;
        }
        else {
          local_1a8.p_ = (char16_t *)ICAL_BYMONTH;
          iVar5 = UnicodeString::compare(&attr,&local_1a8,-1);
          if (iVar5 == '\0') {
            uVar8 = value.fUnion.fFields.fLength;
            if (-1 < value.fUnion.fStackFields.fLengthAndFlags) {
              uVar8 = (int)value.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (2 < (int)uVar8) goto LAB_002148f3;
            iVar7 = parseAsciiDigits(&value,0,uVar8,status);
            *month = iVar7 + -1;
            UVar9 = *status;
            if ((iVar7 - 0xdU < 0xfffffff4) || (U_ZERO_ERROR < UVar9)) goto LAB_002148fd;
          }
          else {
            local_1b0.p_ = (char16_t *)ICAL_BYDAY;
            iVar5 = UnicodeString::compare(&attr,&local_1b0,-1);
            if (iVar5 == '\0') {
              uVar8 = value.fUnion.fFields.fLength;
              if (-1 < value.fUnion.fStackFields.fLengthAndFlags) {
                uVar8 = (int)value.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if (uVar8 - 5 < 0xfffffffd) goto LAB_002148f3;
              if (2 < (uint)uVar8) {
                cVar6 = UnicodeString::doCharAt(&value,0);
                iVar10 = 1;
                if (cVar6 != L'+') {
                  cVar6 = UnicodeString::doCharAt(&value,0);
                  iVar10 = -1;
                  if ((cVar6 != L'-') && (iVar10 = 1, uVar8 == 4)) goto LAB_002148f3;
                }
                iVar7 = parseAsciiDigits(&value,uVar8 - 3,1,status);
                if ((4 < iVar7) || ((iVar7 == 0 || (U_ZERO_ERROR < *status)))) goto LAB_002148f3;
                *wim = iVar7 * iVar10;
                UnicodeString::remove(&value,(char *)0x0);
              }
              puVar12 = ICAL_DOW_NAMES;
              lVar11 = -7;
              while( true ) {
                if (lVar11 == 0) goto LAB_002148f3;
                local_1b8.p_ = (char16_t *)puVar12;
                iVar5 = UnicodeString::compare(&value,&local_1b8,2);
                if (iVar5 == '\0') break;
                lVar11 = lVar11 + 1;
                puVar12 = (undefined1 *)((long)puVar12 + 6);
              }
              *dow = (int)lVar11 + 8;
            }
            else {
              local_1c0.p_ = (char16_t *)ICAL_BYMONTHDAY;
              iVar5 = UnicodeString::compare(&attr,&local_1c0,-1);
              if (iVar5 == '\0') {
                bVar2 = true;
                local_1d0 = 0;
                iVar10 = 0;
                while (piVar4 = local_188, bVar2) {
                  uVar8 = UnicodeString::indexOf(&value,L',',iVar10);
                  if (uVar8 == -1) {
                    uVar8 = value.fUnion.fFields.fLength;
                    if (-1 < value.fUnion.fStackFields.fLengthAndFlags) {
                      uVar8 = (int)value.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    bVar2 = false;
                  }
                  else {
                    bVar2 = true;
                  }
                  if (*piVar4 <= local_1d0) {
                    *status = U_BUFFER_OVERFLOW_ERROR;
                    goto LAB_0021491d;
                  }
                  iVar7 = parseAsciiDigits(&value,iVar10,uVar8 - iVar10,status);
                  dom[local_1d0] = iVar7;
                  if (U_ZERO_ERROR < *status) goto LAB_0021491d;
                  local_1d0 = local_1d0 + 1;
                  iVar10 = uVar8 + 1;
                }
              }
            }
          }
        }
      }
      local_198.p_ = (char16_t *)ICAL_YEARLY;
      iVar5 = UnicodeString::compare(&value,&local_198,-1);
      bVar3 = false;
    } while (iVar5 == '\0');
LAB_002148f3:
    UVar9 = *status;
LAB_002148fd:
    if (UVar9 < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_INVALID_FORMAT_ERROR;
    }
LAB_0021491d:
    UnicodeString::~UnicodeString(&value);
    UnicodeString::~UnicodeString(&attr);
    UnicodeString::~UnicodeString(&prop);
  }
  return;
}

Assistant:

static void parseRRULE(const UnicodeString& rrule, int32_t& month, int32_t& dow, int32_t& wim,
                       int32_t* dom, int32_t& domCount, UDate& until, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    int32_t numDom = 0;

    month = -1;
    dow = 0;
    wim = 0;
    until = MIN_MILLIS;

    UBool yearly = FALSE;
    //UBool parseError = FALSE;

    int32_t prop_start = 0;
    int32_t prop_end;
    UnicodeString prop, attr, value;
    UBool nextProp = TRUE;

    while (nextProp) {
        prop_end = rrule.indexOf(SEMICOLON, prop_start);
        if (prop_end == -1) {
            prop.setTo(rrule, prop_start);
            nextProp = FALSE;
        } else {
            prop.setTo(rrule, prop_start, prop_end - prop_start);
            prop_start = prop_end + 1;
        }
        int32_t eql = prop.indexOf(EQUALS_SIGN);
        if (eql != -1) {
            attr.setTo(prop, 0, eql);
            value.setTo(prop, eql + 1);
        } else {
            goto rruleParseError;
        }

        if (attr.compare(ICAL_FREQ, -1) == 0) {
            // only support YEARLY frequency type
            if (value.compare(ICAL_YEARLY, -1) == 0) {
                yearly = TRUE;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_UNTIL, -1) == 0) {
            // ISO8601 UTC format, for example, "20060315T020000Z"
            until = parseDateTimeString(value, 0, status);
            if (U_FAILURE(status)) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTH, -1) == 0) {
            // Note: BYMONTH may contain multiple months, but only single month make sense for
            // VTIMEZONE property.
            if (value.length() > 2) {
                goto rruleParseError;
            }
            month = parseAsciiDigits(value, 0, value.length(), status) - 1;
            if (U_FAILURE(status) || month < 0 || month >= 12) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYDAY, -1) == 0) {
            // Note: BYDAY may contain multiple day of week separated by comma.  It is unlikely used for
            // VTIMEZONE property.  We do not support the case.

            // 2-letter format is used just for representing a day of week, for example, "SU" for Sunday
            // 3 or 4-letter format is used for represeinging Nth day of week, for example, "-1SA" for last Saturday
            int32_t length = value.length();
            if (length < 2 || length > 4) {
                goto rruleParseError;
            }
            if (length > 2) {
                // Nth day of week
                int32_t sign = 1;
                if (value.charAt(0) == PLUS) {
                    sign = 1;
                } else if (value.charAt(0) == MINUS) {
                    sign = -1;
                } else if (length == 4) {
                    goto rruleParseError;
                }
                int32_t n = parseAsciiDigits(value, length - 3, 1, status);
                if (U_FAILURE(status) || n == 0 || n > 4) {
                    goto rruleParseError;
                }
                wim = n * sign;
                value.remove(0, length - 2);
            }
            int32_t wday;
            for (wday = 0; wday < 7; wday++) {
                if (value.compare(ICAL_DOW_NAMES[wday], 2) == 0) {
                    break;
                }
            }
            if (wday < 7) {
                // Sunday(1) - Saturday(7)
                dow = wday + 1;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTHDAY, -1) == 0) {
            // Note: BYMONTHDAY may contain multiple days delimitted by comma
            //
            // A value of BYMONTHDAY could be negative, for example, -1 means
            // the last day in a month
            int32_t dom_idx = 0;
            int32_t dom_start = 0;
            int32_t dom_end;
            UBool nextDOM = TRUE;
            while (nextDOM) {
                dom_end = value.indexOf(COMMA, dom_start);
                if (dom_end == -1) {
                    dom_end = value.length();
                    nextDOM = FALSE;
                }
                if (dom_idx < domCount) {
                    dom[dom_idx] = parseAsciiDigits(value, dom_start, dom_end - dom_start, status);
                    if (U_FAILURE(status)) {
                        goto rruleParseError;
                    }
                    dom_idx++;
                } else {
                    status = U_BUFFER_OVERFLOW_ERROR;
                    goto rruleParseError;
                }
                dom_start = dom_end + 1;
            }
            numDom = dom_idx;
        }
    }
    if (!yearly) {
        // FREQ=YEARLY must be set
        goto rruleParseError;
    }
    // Set actual number of parsed DOM (ICAL_BYMONTHDAY)
    domCount = numDom;
    return;

rruleParseError:
    if (U_SUCCESS(status)) {
        // Set error status
        status = U_INVALID_FORMAT_ERROR;
    }
}